

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2frames.cpp
# Opt level: O0

void __thiscall
Http2::FrameWriter::start(FrameWriter *this,FrameType type,FrameFlags flags,quint32 streamID)

{
  long lVar1;
  uint uVar2;
  Int IVar3;
  reference pvVar4;
  uint in_ECX;
  undefined4 in_EDX;
  undefined1 in_SIL;
  size_type in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer;
  void *in_stack_ffffffffffffffc8;
  undefined3 in_stack_ffffffffffffffe4;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = CONCAT13(in_SIL,in_stack_ffffffffffffffe4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_EDX,in_stack_fffffffffffffff0),in_RDI);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      CONCAT44(uVar5,in_ECX),in_RDI);
  *pvVar4 = '\0';
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      CONCAT44(uVar5,in_ECX),in_RDI);
  *pvVar4 = '\0';
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      CONCAT44(uVar5,in_ECX),in_RDI);
  *pvVar4 = '\0';
  uVar2 = (uint)uVar5 >> 0x18;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      CONCAT44(uVar5,in_ECX),in_RDI);
  *pvVar4 = (value_type)uVar2;
  IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xfffffffffffffff4);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      CONCAT44(uVar5,in_ECX),in_RDI);
  *pvVar4 = (value_type)IVar3;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)CONCAT44(uVar5,in_ECX),in_RDI)
  ;
  qToBigEndian<unsigned_int>(in_ECX,in_stack_ffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void FrameWriter::start(FrameType type, FrameFlags flags, quint32 streamID)
{
    auto &buffer = frame.buffer;

    buffer.resize(frameHeaderSize);
    // The first three bytes - payload size, which is 0 for now.
    buffer[0] = 0;
    buffer[1] = 0;
    buffer[2] = 0;

    buffer[3] = uchar(type);
    buffer[4] = uchar(flags);

    qToBigEndian(streamID, &buffer[5]);
}